

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void write_sms_palette_file(Config config,char *filename,Image *input_image)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  byte bVar4;
  int i;
  long lVar5;
  uint8_t c;
  char buf [3];
  byte local_234;
  char local_233 [3];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)filename);
  if (config.output_bin == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,".db",3);
  }
  lVar5 = 0;
  do {
    while( true ) {
      bVar1 = input_image->palette[lVar5].red;
      if (bVar1 < 0x38) {
        bVar2 = 0;
      }
      else {
        bVar2 = 1;
        if (0x79 < bVar1) {
          bVar2 = bVar1 < 0xbc ^ 3;
        }
      }
      bVar1 = input_image->palette[lVar5].green;
      if (bVar1 < 0x38) {
        bVar4 = 0;
      }
      else {
        bVar4 = 4;
        if (0x79 < bVar1) {
          bVar4 = (0xbb < bVar1) << 2 | 8;
        }
      }
      bVar1 = input_image->palette[lVar5].blue;
      if (bVar1 < 0x38) {
        local_234 = 0;
      }
      else {
        local_234 = 0x10;
        if (0x79 < bVar1) {
          local_234 = (0xbb < bVar1) << 4 | 0x20;
        }
      }
      local_234 = bVar4 | bVar2 | local_234;
      if (config.output_bin != false) break;
      sprintf(local_233,"%02X",(ulong)local_234);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," $",2);
      sVar3 = strlen(local_233);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,local_233,sVar3);
      lVar5 = lVar5 + 1;
      if (lVar5 == 0x10) goto LAB_00114ffb;
    }
    std::ostream::write((char *)&local_230,(long)&local_234);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10);
  if (config.output_bin == false) {
LAB_00114ffb:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void write_sms_palette_file(Config config, const char *filename, Image *input_image) {
    std::ofstream out;
    out.open(filename, config.output_bin ?
        std::ofstream::binary : std::ofstream::out);

    if (!config.output_bin) out << ".db";

    for (int i = 0; i < MAX_COLOURS; i++) {
        uint8_t c = (convert_colour_channel_to_2bit((uint8_t) input_image->palette[i].red)
                   | (convert_colour_channel_to_2bit((uint8_t) input_image->palette[i].green) << 2)
                   | (convert_colour_channel_to_2bit((uint8_t) input_image->palette[i].blue) << 4));

        if (!config.output_bin) {
            char buf[3];
            sprintf(buf, "%02X", c);
            out << " $" << buf;
        } else out.write((const char*)&c, 1);
    }
    if (!config.output_bin) out << "\n";

    out.close();
}